

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

KeyData * __thiscall
cfd::core::KeyData::DerivePrivkey
          (KeyData *__return_storage_ptr__,KeyData *this,string *path,bool has_rebase_path)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> arr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"KeyData::DerivePrivkey","")
  ;
  ToArrayFromString(&local_60,path,&local_48,'\0');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,&local_60);
  DerivePrivkey(__return_storage_ptr__,this,&local_78,has_rebase_path);
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

KeyData KeyData::DerivePrivkey(std::string path, bool has_rebase_path) const {
  auto arr = ToArrayFromString(path, "KeyData::DerivePrivkey", 0);
  return DerivePrivkey(arr, has_rebase_path);
}